

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNStm * __thiscall CTcParser::parse_while(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  CTPNStm *pCVar2;
  CTPNStmEnclosing *this_00;
  CTcTokFileDesc *pCVar3;
  int *siz;
  CTPNStmEnclosing *pCVar4;
  
  siz = err;
  tVar1 = CTcTokenizer::next(G_tok);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(G_tok);
  }
  else {
    siz = (int *)0x2b3f;
    CTcTokenizer::log_error_curtok(G_tok,0x2b3f);
  }
  pCVar2 = (CTPNStm *)parse_cond_expr(this);
  if (pCVar2 == (CTPNStm *)0x0) {
    *err = 1;
    pCVar4 = (CTPNStmEnclosing *)0x0;
  }
  else {
    this_00 = (CTPNStmEnclosing *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x48,(size_t)siz);
    pCVar4 = this->enclosing_stm_;
    CTPNStmBase::CTPNStmBase((CTPNStmBase *)this_00);
    this_00->enclosing_ = pCVar4;
    this_00[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase = (_func_int **)pCVar2;
    this_00[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)0x0;
    (this_00->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00365af0;
    if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b40);
    }
    pCVar4 = this->enclosing_stm_;
    this->enclosing_stm_ = this_00;
    pCVar3 = (CTcTokFileDesc *)parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
    this->enclosing_stm_ = pCVar4;
    pCVar4 = (CTPNStmEnclosing *)0x0;
    if (*err == 0) {
      this_00[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)pCVar3;
      pCVar4 = this_00;
    }
  }
  return &pCVar4->super_CTPNStm;
}

Assistant:

CTPNStm *CTcParser::parse_while(int *err)
{
    CTcPrsNode *expr;
    CTPNStm *body_stm;
    CTPNStmWhile *while_stm;
    CTPNStmEnclosing *old_enclosing;
    
    /* skip the 'while' and check for the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and proceed on the assumption that the paren
         *   was simply left out and the statement is otherwise
         *   well-formed 
         */
        G_tok->log_error_curtok(TCERR_REQ_WHILE_LPAR);
    }

    /* parse the condition expression */
    expr = parse_cond_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* create the 'while' statement node */
    while_stm = new CTPNStmWhile(expr, enclosing_stm_);

    /* check for the close paren */
    if (G_tok->cur() == TOKT_RPAR)
    {
        /* skip the paren */
        G_tok->next();
    }
    else
    {
        /* log an error, and continue from here */
        G_tok->log_error_curtok(TCERR_REQ_WHILE_RPAR);
    }

    /* set the 'while' to enclose its body */
    old_enclosing = set_enclosing_stm(while_stm);

    /* parse the loop body */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* give up on error */
    if (*err)
        return 0;

    /* set the body */
    while_stm->set_body(body_stm);

    /* that's it - build and return the 'while' node */
    return while_stm;
}